

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int mp_fprint_ext_test(FILE *file,char **data,int depth)

{
  uint32_t uVar1;
  int iVar2;
  int8_t type;
  char *ext;
  char local_29;
  char *local_28;
  
  uVar1 = mp_decode_extl(data,&local_29);
  local_28 = *data;
  *data = local_28 + uVar1;
  if (local_29 == '\x01') {
    iVar2 = mp_fprint_recursion(file,&local_28,depth);
  }
  else if (local_29 == '\0') {
    iVar2 = fprintf((FILE *)file,"%.*s",(ulong)uVar1);
  }
  else {
    iVar2 = fprintf((FILE *)file,"undefined");
  }
  return iVar2;
}

Assistant:

static int
mp_fprint_ext_test(FILE *file, const char **data, int depth)
{
	int8_t type;
	uint32_t len = mp_decode_extl(data, &type);
	const char *ext = *data;
	*data += len;
	switch(type) {
	case MP_EXT_TEST_PLAIN:
		return fprintf(file, "%.*s", len, ext);
	case MP_EXT_TEST_MSGPACK:
		return mp_fprint_recursion(file, &ext, depth);
	}
	return fprintf(file, "undefined");
}